

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

size_t enet_range_coder_decompress
                 (void *context,enet_uint8 *inData,size_t inLimit,enet_uint8 *outData,
                 size_t outLimit)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ushort uVar4;
  enet_uint16 eVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  byte *in_RCX;
  long in_RDX;
  byte *pbVar9;
  byte *in_RSI;
  undefined1 *in_RDI;
  long in_R8;
  ENetSymbol *node_2;
  enet_uint16 before_1;
  enet_uint16 after_1;
  ENetSymbol *node_1;
  enet_uint16 before;
  enet_uint16 after;
  ENetSymbol *node;
  enet_uint16 total;
  enet_uint16 *parent;
  enet_uint16 bottom;
  enet_uint16 count;
  enet_uint16 under;
  enet_uint16 code;
  enet_uint8 value;
  ENetSymbol *patch;
  ENetSymbol *symbol;
  ENetSymbol *subcontext;
  size_t nextSymbol;
  size_t order;
  enet_uint16 predicted;
  ENetSymbol *root;
  enet_uint32 decodeRange;
  enet_uint32 decodeCode;
  enet_uint32 decodeLow;
  enet_uint8 *inEnd;
  enet_uint8 *outEnd;
  enet_uint8 *outStart;
  ENetRangeCoder *rangeCoder;
  int in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  byte *local_e0;
  byte *local_d0;
  byte *local_c0;
  ushort *local_b0;
  ushort local_a2;
  ushort local_a0;
  ushort local_9e;
  byte local_99;
  undefined1 *local_98;
  byte *local_90;
  undefined1 *local_88;
  ulong local_80;
  ulong local_78;
  ushort local_6a;
  undefined1 *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  undefined1 *local_38;
  byte *local_28;
  byte *local_18;
  
  local_48 = in_RCX + in_R8;
  local_50 = in_RSI + in_RDX;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0xffffffff;
  local_6a = 0;
  local_78 = 0;
  if ((in_RDI == (undefined1 *)0x0) || (in_RDX == 0)) {
    return 0;
  }
  local_80 = 1;
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined2 *)(in_RDI + 2) = 0;
  *(undefined2 *)(in_RDI + 4) = 0;
  *(undefined2 *)(in_RDI + 6) = 0;
  *(undefined2 *)(in_RDI + 8) = 0;
  *(undefined2 *)(in_RDI + 10) = 0;
  *(undefined2 *)(in_RDI + 0xc) = 0;
  *(undefined2 *)(in_RDI + 0xe) = 0;
  *(undefined2 *)(in_RDI + 10) = 1;
  *(undefined2 *)(in_RDI + 0xc) = 0x101;
  *(undefined2 *)(in_RDI + 8) = 0;
  local_18 = in_RSI;
  if (in_RSI < local_50) {
    local_18 = in_RSI + 1;
    local_58 = (uint)*in_RSI << 0x18;
  }
  if (local_18 < local_50) {
    local_58 = (uint)*local_18 << 0x10 | local_58;
    local_18 = local_18 + 1;
  }
  if (local_18 < local_50) {
    local_58 = (uint)*local_18 << 8 | local_58;
    local_18 = local_18 + 1;
  }
  local_68 = in_RDI;
  local_40 = in_RCX;
  local_38 = in_RDI;
  local_28 = in_RCX;
  if (local_18 < local_50) {
    local_58 = *local_18 | local_58;
    local_28 = in_RCX;
    local_18 = local_18 + 1;
  }
LAB_001039ad:
  local_b0 = &local_6a;
  uVar4 = local_6a;
LAB_001039de:
  local_88 = local_38 + (ulong)uVar4 * 0x10;
  if (local_88 != local_68) {
    if ((*(short *)(local_88 + 10) == 0) ||
       (*(ushort *)(local_88 + 0xc) <= *(ushort *)(local_88 + 10))) goto LAB_00103f18;
    uVar3 = (ulong)local_5c / (ulong)*(ushort *)(local_88 + 0xc);
    iVar8 = (int)uVar3;
    uVar4 = (ushort)((local_58 - local_54) / uVar3);
    if (uVar4 < *(ushort *)(local_88 + 10)) {
      local_5c = (uint)*(ushort *)(local_88 + 10) * iVar8;
      do {
        if (0xffffff < (local_54 ^ local_54 + local_5c)) {
          if (0xffff < local_5c) goto LAB_00103f18;
          local_5c = -local_54 & 0xffff;
        }
        local_58 = local_58 << 8;
        if (local_18 < local_50) {
          local_58 = *local_18 | local_58;
          local_18 = local_18 + 1;
        }
        local_5c = local_5c << 8;
        local_54 = local_54 << 8;
      } while( true );
    }
    uVar4 = uVar4 - *(short *)(local_88 + 10);
    local_9e = 0;
    if (*(short *)(local_88 + 8) == 0) {
      return 0;
    }
    local_c0 = local_88 + (long)(int)(uint)*(ushort *)(local_88 + 8) * 0x10;
    while( true ) {
      while( true ) {
        uVar6 = local_9e + *(short *)(local_c0 + 2);
        bVar1 = local_c0[1];
        if (uVar4 < uVar6) break;
        local_9e = local_9e + *(short *)(local_c0 + 2);
        if (*(short *)(local_c0 + 6) == 0) {
          return 0;
        }
        local_c0 = local_c0 + (long)(int)(uint)*(ushort *)(local_c0 + 6) * 0x10;
      }
      if ((int)((uint)uVar6 - (uint)(ushort)bVar1) <= (int)(uint)uVar4) break;
      *(short *)(local_c0 + 2) = *(short *)(local_c0 + 2) + 2;
      if (*(short *)(local_c0 + 4) == 0) {
        return 0;
      }
      local_c0 = local_c0 + (long)(int)(uint)*(ushort *)(local_c0 + 4) * 0x10;
    }
    local_99 = *local_c0;
    bVar2 = local_c0[1];
    *(short *)(local_c0 + 2) = *(short *)(local_c0 + 2) + 2;
    local_c0[1] = local_c0[1] + 2;
    local_a2 = (ushort)((long)local_c0 - (long)local_38 >> 4);
    local_5c = (uint)(ushort)bVar2 * iVar8;
    for (local_54 = ((uint)*(ushort *)(local_88 + 10) + (uint)(ushort)(uVar6 - bVar1)) * iVar8 +
                    local_54; (local_54 ^ local_54 + local_5c) < 0x1000000; local_54 = local_54 << 8
        ) {
LAB_00103dd3:
      local_58 = local_58 << 8;
      if (local_18 < local_50) {
        local_58 = *local_18 | local_58;
        local_18 = local_18 + 1;
      }
      local_5c = local_5c << 8;
    }
    if (local_5c < 0x10000) {
      local_5c = -local_54 & 0xffff;
      goto LAB_00103dd3;
    }
    *(short *)(local_88 + 0xc) = *(short *)(local_88 + 0xc) + 2;
    if ((0xfb < bVar2) || (0xff00 < *(ushort *)(local_88 + 0xc))) {
      if (*(short *)(local_88 + 8) == 0) {
        eVar5 = 0;
      }
      else {
        eVar5 = enet_symbol_rescale((ENetSymbol *)
                                    CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      }
      *(enet_uint16 *)(local_88 + 0xc) = eVar5;
      *(short *)(local_88 + 10) =
           *(short *)(local_88 + 10) - (short)((int)(uint)*(ushort *)(local_88 + 10) >> 1);
      *(short *)(local_88 + 0xc) = *(short *)(local_88 + 0xc) + *(short *)(local_88 + 10);
    }
    goto LAB_0010470e;
  }
  iVar8 = (int)((ulong)local_5c / (ulong)*(ushort *)(local_68 + 0xc));
  uVar4 = (ushort)((ulong)(local_58 - local_54) /
                  ((ulong)local_5c / (ulong)*(ushort *)(local_68 + 0xc)));
  if (uVar4 < *(ushort *)(local_68 + 10)) {
    local_5c = (uint)*(ushort *)(local_68 + 10) * iVar8;
    do {
      if (0xffffff < (local_54 ^ local_54 + local_5c)) {
        if (0xffff < local_5c) {
          return (long)local_28 - (long)local_40;
        }
        local_5c = -local_54 & 0xffff;
      }
      if (local_18 < local_50) {
        local_18 = local_18 + 1;
      }
      local_5c = local_5c << 8;
      local_54 = local_54 << 8;
    } while( true );
  }
  uVar4 = uVar4 - *(short *)(local_68 + 10);
  local_9e = 0;
  local_a0 = 1;
  if (*(short *)(local_68 + 8) == 0) {
    local_99 = (byte)((ulong)uVar4 / 1);
    local_90 = local_38 + local_80 * 0x10;
    *local_90 = local_99;
    local_90[1] = 3;
    local_90[2] = 3;
    local_90[3] = 0;
    local_90[4] = 0;
    local_90[5] = 0;
    local_90[6] = 0;
    local_90[7] = 0;
    local_90[8] = 0;
    local_90[9] = 0;
    local_90[10] = 0;
    local_90[0xb] = 0;
    local_90[0xc] = 0;
    local_90[0xd] = 0;
    local_90[0xe] = 0;
    local_90[0xf] = 0;
    *(short *)(local_68 + 8) = (short)((long)local_90 - (long)local_68 >> 4);
    local_9e = uVar4;
    local_80 = local_80 + 1;
  }
  else {
    local_d0 = local_68 + (long)(int)(uint)*(ushort *)(local_68 + 8) * 0x10;
    while( true ) {
      while( true ) {
        uVar6 = local_9e + *(short *)(local_d0 + 2) + *local_d0 + 1;
        uVar7 = local_d0[1] + 1;
        if (uVar4 < uVar6) break;
        local_9e = local_9e + *(short *)(local_d0 + 2);
        if (*(short *)(local_d0 + 6) == 0) {
          local_99 = *local_d0 + 1 + (char)((int)((uint)uVar4 - (uint)uVar6) / 1);
          local_9e = uVar4 - (short)((int)((uint)uVar4 - (uint)uVar6) % 1);
          local_90 = local_38 + local_80 * 0x10;
          *local_90 = local_99;
          local_90[1] = 3;
          local_90[2] = 3;
          local_90[3] = 0;
          local_90[4] = 0;
          local_90[5] = 0;
          local_90[6] = 0;
          local_90[7] = 0;
          local_90[8] = 0;
          local_90[9] = 0;
          local_90[10] = 0;
          local_90[0xb] = 0;
          local_90[0xc] = 0;
          local_90[0xd] = 0;
          local_90[0xe] = 0;
          local_90[0xf] = 0;
          *(short *)(local_d0 + 6) = (short)((long)local_90 - (long)local_d0 >> 4);
          local_80 = local_80 + 1;
          goto LAB_0010452e;
        }
        local_d0 = local_d0 + (long)(int)(uint)*(ushort *)(local_d0 + 6) * 0x10;
      }
      if ((int)((uint)uVar6 - (uint)uVar7) <= (int)(uint)uVar4) {
        local_99 = *local_d0;
        local_a0 = local_d0[1] + 1;
        local_9e = uVar6 - uVar7;
        *(short *)(local_d0 + 2) = *(short *)(local_d0 + 2) + 3;
        local_d0[1] = local_d0[1] + 3;
        local_90 = local_d0;
        goto LAB_0010452e;
      }
      *(short *)(local_d0 + 2) = *(short *)(local_d0 + 2) + 3;
      if (*(short *)(local_d0 + 4) == 0) break;
      local_d0 = local_d0 + (long)(int)(uint)*(ushort *)(local_d0 + 4) * 0x10;
    }
    in_stack_ffffffffffffff00 = *local_d0 - 1;
    local_99 = (char)in_stack_ffffffffffffff00 -
               (char)((int)((((uint)uVar6 - (uint)uVar7) - (uint)uVar4) + -1) / 1);
    in_stack_ffffffffffffff04 = (uint)uVar4;
    local_9e = uVar4 - (short)((int)((((uint)uVar6 - (uint)uVar7) - (uint)uVar4) + -1) % 1);
    local_90 = local_38 + local_80 * 0x10;
    *local_90 = local_99;
    local_90[1] = 3;
    local_90[2] = 3;
    local_90[3] = 0;
    local_90[4] = 0;
    local_90[5] = 0;
    local_90[6] = 0;
    local_90[7] = 0;
    local_90[8] = 0;
    local_90[9] = 0;
    local_90[10] = 0;
    local_90[0xb] = 0;
    local_90[0xc] = 0;
    local_90[0xd] = 0;
    local_90[0xe] = 0;
    local_90[0xf] = 0;
    *(short *)(local_d0 + 4) = (short)((long)local_90 - (long)local_d0 >> 4);
    local_80 = local_80 + 1;
  }
LAB_0010452e:
  local_a2 = (ushort)((long)local_90 - (long)local_38 >> 4);
  local_54 = ((uint)*(ushort *)(local_68 + 10) + (uint)local_9e) * iVar8 + local_54;
  local_5c = (uint)local_a0 * iVar8;
  do {
    if (0xffffff < (local_54 ^ local_54 + local_5c)) {
      if (0xffff < local_5c) goto LAB_0010463b;
      local_5c = -local_54 & 0xffff;
    }
    local_58 = local_58 << 8;
    if (local_18 < local_50) {
      local_58 = *local_18 | local_58;
      local_18 = local_18 + 1;
    }
    local_5c = local_5c << 8;
    local_54 = local_54 << 8;
  } while( true );
LAB_00103f18:
  uVar4 = *(ushort *)(local_88 + 0xe);
  goto LAB_001039de;
LAB_0010463b:
  *(short *)(local_68 + 0xc) = *(short *)(local_68 + 0xc) + 3;
  if ((0xfa < local_a0) || (0xff00 < *(ushort *)(local_68 + 0xc))) {
    if (*(short *)(local_68 + 8) == 0) {
      eVar5 = 0;
    }
    else {
      eVar5 = enet_symbol_rescale((ENetSymbol *)
                                  CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    }
    *(enet_uint16 *)(local_68 + 0xc) = eVar5;
    *(short *)(local_68 + 10) =
         *(short *)(local_68 + 10) - (short)((int)(uint)*(ushort *)(local_68 + 10) >> 1);
    *(short *)(local_68 + 0xc) = *(short *)(local_68 + 0xc) + *(short *)(local_68 + 10) + 0x100;
  }
LAB_0010470e:
  for (local_98 = local_38 + (ulong)local_6a * 0x10; local_98 != local_88;
      local_98 = local_38 + (ulong)*(ushort *)(local_98 + 0xe) * 0x10) {
    bVar1 = 0;
    if (*(short *)(local_98 + 8) == 0) {
      local_90 = local_38 + local_80 * 0x10;
      *local_90 = local_99;
      local_90[1] = 2;
      local_90[2] = 2;
      local_90[3] = 0;
      local_90[4] = 0;
      local_90[5] = 0;
      local_90[6] = 0;
      local_90[7] = 0;
      local_90[8] = 0;
      local_90[9] = 0;
      local_90[10] = 0;
      local_90[0xb] = 0;
      local_90[0xc] = 0;
      local_90[0xd] = 0;
      local_90[0xe] = 0;
      local_90[0xf] = 0;
      *(short *)(local_98 + 8) = (short)((long)local_90 - (long)local_98 >> 4);
      local_80 = local_80 + 1;
    }
    else {
      local_e0 = local_98 + (long)(int)(uint)*(ushort *)(local_98 + 8) * 0x10;
      while( true ) {
        for (; local_99 < *local_e0;
            local_e0 = local_e0 + (long)(int)(uint)*(ushort *)(local_e0 + 4) * 0x10) {
          *(short *)(local_e0 + 2) = *(short *)(local_e0 + 2) + 2;
          if (*(short *)(local_e0 + 4) == 0) {
            local_90 = local_38 + local_80 * 0x10;
            *local_90 = local_99;
            local_90[1] = 2;
            local_90[2] = 2;
            local_90[3] = 0;
            local_90[4] = 0;
            local_90[5] = 0;
            local_90[6] = 0;
            local_90[7] = 0;
            local_90[8] = 0;
            local_90[9] = 0;
            local_90[10] = 0;
            local_90[0xb] = 0;
            local_90[0xc] = 0;
            local_90[0xd] = 0;
            local_90[0xe] = 0;
            local_90[0xf] = 0;
            *(short *)(local_e0 + 4) = (short)((long)local_90 - (long)local_e0 >> 4);
            local_80 = local_80 + 1;
            goto LAB_00104a91;
          }
        }
        if (local_99 <= *local_e0) {
          bVar1 = local_e0[1];
          *(short *)(local_e0 + 2) = *(short *)(local_e0 + 2) + 2;
          local_e0[1] = local_e0[1] + 2;
          local_90 = local_e0;
          goto LAB_00104a91;
        }
        if (*(short *)(local_e0 + 6) == 0) break;
        local_e0 = local_e0 + (long)(int)(uint)*(ushort *)(local_e0 + 6) * 0x10;
      }
      local_90 = local_38 + local_80 * 0x10;
      *local_90 = local_99;
      local_90[1] = 2;
      local_90[2] = 2;
      local_90[3] = 0;
      local_90[4] = 0;
      local_90[5] = 0;
      local_90[6] = 0;
      local_90[7] = 0;
      local_90[8] = 0;
      local_90[9] = 0;
      local_90[10] = 0;
      local_90[0xb] = 0;
      local_90[0xc] = 0;
      local_90[0xd] = 0;
      local_90[0xe] = 0;
      local_90[0xf] = 0;
      *(short *)(local_e0 + 6) = (short)((long)local_90 - (long)local_e0 >> 4);
      local_80 = local_80 + 1;
    }
LAB_00104a91:
    *local_b0 = (ushort)((long)local_90 - (long)local_38 >> 4);
    local_b0 = (ushort *)(local_90 + 0xe);
    if (bVar1 == 0) {
      *(short *)(local_98 + 10) = *(short *)(local_98 + 10) + 5;
      *(short *)(local_98 + 0xc) = *(short *)(local_98 + 0xc) + 5;
    }
    *(short *)(local_98 + 0xc) = *(short *)(local_98 + 0xc) + 2;
    if ((0xfb < bVar1) || (0xff00 < *(ushort *)(local_98 + 0xc))) {
      if (*(short *)(local_98 + 8) == 0) {
        eVar5 = 0;
      }
      else {
        eVar5 = enet_symbol_rescale((ENetSymbol *)
                                    CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      }
      *(enet_uint16 *)(local_98 + 0xc) = eVar5;
      *(short *)(local_98 + 10) =
           *(short *)(local_98 + 10) - (short)((int)(uint)*(ushort *)(local_98 + 10) >> 1);
      *(short *)(local_98 + 0xc) = *(short *)(local_98 + 0xc) + *(short *)(local_98 + 10);
    }
  }
  *local_b0 = local_a2;
  if (local_48 <= local_28) {
    return 0;
  }
  pbVar9 = local_28 + 1;
  *local_28 = local_99;
  if (local_78 < 2) {
    local_78 = local_78 + 1;
  }
  else {
    local_6a = *(ushort *)(local_38 + (ulong)local_6a * 0x10 + 0xe);
  }
  local_28 = pbVar9;
  if (0xffd < local_80) {
    local_80 = 1;
    local_68 = local_38;
    *local_38 = 0;
    local_38[1] = 0;
    *(undefined2 *)(local_38 + 2) = 0;
    *(undefined2 *)(local_38 + 4) = 0;
    *(undefined2 *)(local_38 + 6) = 0;
    *(undefined2 *)(local_38 + 8) = 0;
    *(undefined2 *)(local_38 + 10) = 0;
    *(undefined2 *)(local_38 + 0xc) = 0;
    *(undefined2 *)(local_38 + 0xe) = 0;
    *(undefined2 *)(local_38 + 10) = 1;
    *(undefined2 *)(local_38 + 0xc) = 0x101;
    *(undefined2 *)(local_38 + 8) = 0;
    local_6a = 0;
    local_78 = 0;
  }
  goto LAB_001039ad;
}

Assistant:

size_t
enet_range_coder_decompress (void * context, const enet_uint8 * inData, size_t inLimit, enet_uint8 * outData, size_t outLimit)
{
    ENetRangeCoder * rangeCoder = (ENetRangeCoder *) context;
    enet_uint8 * outStart = outData, * outEnd = & outData [outLimit];
    const enet_uint8 * inEnd = & inData [inLimit];
    enet_uint32 decodeLow = 0, decodeCode = 0, decodeRange = ~0;
    ENetSymbol * root;
    enet_uint16 predicted = 0;
    size_t order = 0, nextSymbol = 0;
#ifdef ENET_CONTEXT_EXCLUSION
    ENetExclude excludes [256];
    ENetExclude * nextExclude = excludes;
#endif
  
    if (rangeCoder == NULL || inLimit <= 0)
      return 0;

    ENET_CONTEXT_CREATE (root, ENET_CONTEXT_ESCAPE_MINIMUM, ENET_CONTEXT_SYMBOL_MINIMUM);

    ENET_RANGE_CODER_SEED;

    for (;;)
    {
        ENetSymbol * subcontext, * symbol, * patch;
#ifdef ENET_CONTEXT_EXCLUSION
        const ENetSymbol * childContext = & emptyContext;
#endif
        enet_uint8 value = 0;
        enet_uint16 code, under, count, bottom, * parent = & predicted, total;

        for (subcontext = & rangeCoder -> symbols [predicted];
             subcontext != root;
#ifdef ENET_CONTEXT_EXCLUSION
             childContext = subcontext, 
#endif
                subcontext = & rangeCoder -> symbols [subcontext -> parent])
        {
            if (subcontext -> escapes <= 0)
              continue;
            total = subcontext -> total;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > 0) 
              ENET_CONTEXT_DECODE_EXCLUDE (childContext, total, 0); 
#endif
            if (subcontext -> escapes >= total)
              continue;
            code = ENET_RANGE_CODER_READ (total);
            if (code < subcontext -> escapes) 
            {
                ENET_RANGE_CODER_DECODE (0, subcontext -> escapes, total); 
                continue;
            }
            code -= subcontext -> escapes;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > 0)
            {
                ENET_CONTEXT_TRY_DECODE (subcontext, symbol, code, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0, ENET_CONTEXT_EXCLUDED); 
            }
            else
#endif
            {
                ENET_CONTEXT_TRY_DECODE (subcontext, symbol, code, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0, ENET_CONTEXT_NOT_EXCLUDED); 
            }
            bottom = symbol - rangeCoder -> symbols;
            ENET_RANGE_CODER_DECODE (subcontext -> escapes + under, count, total);
            subcontext -> total += ENET_SUBCONTEXT_SYMBOL_DELTA;
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || subcontext -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (subcontext, 0);
            goto patchContexts;
        }

        total = root -> total;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > 0)
          ENET_CONTEXT_DECODE_EXCLUDE (childContext, total, ENET_CONTEXT_SYMBOL_MINIMUM);  
#endif
        code = ENET_RANGE_CODER_READ (total);
        if (code < root -> escapes)
        {
            ENET_RANGE_CODER_DECODE (0, root -> escapes, total);
            break;
        }
        code -= root -> escapes;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > 0)
        {
            ENET_CONTEXT_ROOT_DECODE (root, symbol, code, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM, ENET_CONTEXT_EXCLUDED); 
        }
        else
#endif
        {
            ENET_CONTEXT_ROOT_DECODE (root, symbol, code, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM, ENET_CONTEXT_NOT_EXCLUDED); 
        }
        bottom = symbol - rangeCoder -> symbols;
        ENET_RANGE_CODER_DECODE (root -> escapes + under, count, total);
        root -> total += ENET_CONTEXT_SYMBOL_DELTA;
        if (count > 0xFF - 2*ENET_CONTEXT_SYMBOL_DELTA + ENET_CONTEXT_SYMBOL_MINIMUM || root -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
          ENET_CONTEXT_RESCALE (root, ENET_CONTEXT_SYMBOL_MINIMUM);

    patchContexts:
        for (patch = & rangeCoder -> symbols [predicted];
             patch != subcontext;
             patch = & rangeCoder -> symbols [patch -> parent])
        {
            ENET_CONTEXT_ENCODE (patch, symbol, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0);
            * parent = symbol - rangeCoder -> symbols;
            parent = & symbol -> parent;
            if (count <= 0)
            {
                patch -> escapes += ENET_SUBCONTEXT_ESCAPE_DELTA;
                patch -> total += ENET_SUBCONTEXT_ESCAPE_DELTA;
            }
            patch -> total += ENET_SUBCONTEXT_SYMBOL_DELTA; 
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || patch -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (patch, 0);
        }
        * parent = bottom;

        ENET_RANGE_CODER_OUTPUT (value);

        if (order >= ENET_SUBCONTEXT_ORDER)
          predicted = rangeCoder -> symbols [predicted].parent;
        else
          order ++;
        ENET_RANGE_CODER_FREE_SYMBOLS;
    }
                        
    return (size_t) (outData - outStart);
}